

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qelfparser_p.cpp
# Opt level: O1

QString * anon_unknown.dwarf_18ad1e3::ElfHeaderCheck<unsigned_long_long,_(QSysInfo::Endian)1>::
          explainCheckFailure(QString *__return_storage_ptr__,Ehdr *header)

{
  char *s;
  
  if (*(int *)header->e_ident == 0x464c457f) {
    if (header->e_ident[4] == '\x02') {
      if (header->e_ident[5] == '\x01') {
        if ((header->e_ident[6] == '\x01') && (header->e_version == 1)) {
          if (header->e_type == 3) {
            if (header->e_machine == 0x3e) {
              (__return_storage_ptr__->d).d = (Data *)0x0;
              (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
              (__return_storage_ptr__->d).size = 0;
              return __return_storage_ptr__;
            }
            s = "file is for a different processor";
          }
          else {
            s = "file is not a shared object";
          }
        }
        else {
          s = "file has an unknown ELF version";
        }
      }
      else {
        s = "file is for the wrong endianness";
      }
    }
    else {
      s = "file is for a different word size";
    }
  }
  else {
    s = "invalid signature";
  }
  QMetaObject::tr(__return_storage_ptr__,&QLibrary::staticMetaObject,s,(char *)0x0,-1);
  return __return_storage_ptr__;
}

Assistant:

Q_DECL_COLD_FUNCTION static QString explainCheckFailure(const Ehdr &header)
    {
        if (!checkElfMagic(header.e_ident))
            return QLibrary::tr("invalid signature");
        if (!checkClass(header.e_ident))
            return QLibrary::tr("file is for a different word size");
        if (!checkDataOrder(header.e_ident))
            return QLibrary::tr("file is for the wrong endianness");
        if (!checkElfVersion(header.e_ident) || !checkFileVersion(header))
            return QLibrary::tr("file has an unknown ELF version");
        if (!checkOsAbi(header.e_ident) || !checkAbiVersion(header.e_ident))
            return QLibrary::tr("file has an unexpected ABI");
        if (!checkType(header))
            return QLibrary::tr("file is not a shared object");
        if (!checkMachine(header))
            return QLibrary::tr("file is for a different processor");
        return QString();
    }